

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void loadExt(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  sqlite3 *db;
  int iVar1;
  uchar *zFile;
  uchar *zProc;
  char *zErrMsg;
  
  zFile = sqlite3_value_text(*argv);
  db = context->pOut->db;
  zErrMsg = (char *)0x0;
  if ((db->flags & 0x800000) == 0) {
    sqlite3_result_error(context,"not authorized",-1);
    return;
  }
  if (argc == 2) {
    zProc = sqlite3_value_text(argv[1]);
  }
  else {
    zProc = (uchar *)0x0;
  }
  if (zFile != (uchar *)0x0) {
    iVar1 = sqlite3_load_extension(db,(char *)zFile,(char *)zProc,&zErrMsg);
    if (iVar1 != 0) {
      sqlite3_result_error(context,zErrMsg,-1);
      sqlite3_free(zErrMsg);
    }
  }
  return;
}

Assistant:

static void loadExt(sqlite3_context *context, int argc, sqlite3_value **argv){
  const char *zFile = (const char *)sqlite3_value_text(argv[0]);
  const char *zProc;
  sqlite3 *db = sqlite3_context_db_handle(context);
  char *zErrMsg = 0;

  /* Disallow the load_extension() SQL function unless the SQLITE_LoadExtFunc
  ** flag is set.  See the sqlite3_enable_load_extension() API.
  */
  if( (db->flags & SQLITE_LoadExtFunc)==0 ){
    sqlite3_result_error(context, "not authorized", -1);
    return;
  }

  if( argc==2 ){
    zProc = (const char *)sqlite3_value_text(argv[1]);
  }else{
    zProc = 0;
  }
  if( zFile && sqlite3_load_extension(db, zFile, zProc, &zErrMsg) ){
    sqlite3_result_error(context, zErrMsg, -1);
    sqlite3_free(zErrMsg);
  }
}